

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

bool __thiscall
QStyleSheetStyle::styleSheetPalette
          (QStyleSheetStyle *this,QWidget *w,QStyleOption *opt,QPalette *pal)

{
  long lVar1;
  QRenderRule *this_00;
  QWidget *in_RCX;
  long in_RDX;
  long in_RSI;
  QStyleSheetStyle *in_RDI;
  long in_FS_OFFSET;
  QStyleSheetStyleRecursionGuard recursion_guard;
  QRenderRule rule;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  bool local_99;
  undefined4 uVar2;
  undefined3 in_stack_ffffffffffffff6c;
  QFlagsStorage<QStyle::StateFlag> state;
  undefined1 local_90 [72];
  ColorRole in_stack_ffffffffffffffb8;
  ColorRole in_stack_ffffffffffffffbc;
  QPalette *in_stack_ffffffffffffffc0;
  QRenderRule *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RSI == 0) || (in_RDX == 0)) || (in_RCX == (QWidget *)0x0)) {
    local_99 = false;
  }
  else if ((globalStyleSheetStyle == (QStyleSheetStyle *)0x0) || (globalStyleSheetStyle == in_RDI))
  {
    state.i = CONCAT13(0xaa,in_stack_ffffffffffffff6c);
    QStyleSheetStyleRecursionGuard::QStyleSheetStyleRecursionGuard
              ((QStyleSheetStyleRecursionGuard *)&stack0xffffffffffffff6f,in_RDI);
    containerWidget((QWidget *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    memset(local_90,0xaa,0x88);
    uVar2 = *(undefined4 *)(in_RDX + 8);
    this_00 = (QRenderRule *)pseudoClass((State)state.i);
    extendedPseudoClass(in_RCX);
    renderRule((QStyleSheetStyle *)CONCAT44(state.i,uVar2),&w->super_QObject,opt._4_4_,(quint64)pal)
    ;
    local_99 = QRenderRule::hasPalette(this_00);
    if (local_99) {
      QRenderRule::configurePalette
                (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                 in_stack_ffffffffffffffb8);
    }
    QRenderRule::~QRenderRule(this_00);
    QStyleSheetStyleRecursionGuard::~QStyleSheetStyleRecursionGuard
              ((QStyleSheetStyleRecursionGuard *)&stack0xffffffffffffff6f);
  }
  else {
    local_99 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_99;
}

Assistant:

bool QStyleSheetStyle::styleSheetPalette(const QWidget* w, const QStyleOption* opt, QPalette* pal)
{
    if (!w || !opt || !pal)
        return false;

    RECURSION_GUARD(return false)

    w = containerWidget(w);

    QRenderRule rule = renderRule(w, PseudoElement_None, pseudoClass(opt->state) | extendedPseudoClass(w));
    if (!rule.hasPalette())
        return false;

    rule.configurePalette(pal, QPalette::NoRole, QPalette::NoRole);
    return true;
}